

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gles2::Performance::ShaderCompilerLightCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerLightCase *this,int measurementNdx)

{
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  *pvVar1;
  int iVar2;
  LightType LVar3;
  ProgramContext *pPVar4;
  int i;
  deUint32 cacheAvoidanceID;
  long lVar5;
  deUint32 id;
  LightType in_R8D;
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ProgramContext *local_1c8;
  int local_1bc;
  Vec4 local_1b8;
  string nameSpec;
  UniformSpec local_188;
  string ndxStr;
  Vector<float,_16> res;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  cacheAvoidanceID =
       ShaderCompilerCase::getSpecializationID(&this->super_ShaderCompilerCase,measurementNdx);
  getNameSpecialization_abi_cxx11_(&nameSpec,(Performance *)(ulong)cacheAvoidanceID,id);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = __return_storage_ptr__;
  lightVertexTemplate_abi_cxx11_
            ((string *)&res,(Performance *)(ulong)(uint)this->m_numLights,(uint)this->m_isVertexCase
             ,SUB41(this->m_lightType,0),in_R8D);
  specializeShaderSource(&local_188.name,(string *)&res,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&res);
  lightFragmentTemplate_abi_cxx11_
            ((string *)&res,(Performance *)(ulong)(uint)this->m_numLights,(uint)this->m_isVertexCase
             ,SUB41(this->m_lightType,0),in_R8D);
  specializeShaderSource(&local_188.name,(string *)&res,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)&local_1c8->fragShaderSource,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&res);
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_88[0]._M_allocated_capacity = (pointer)0x0;
  std::operator+(&ndxStr,"a_position",&nameSpec);
  local_1e8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_1e8._M_string_length = 0x3f80000000000000;
  local_58._M_dataplus._M_p = (pointer)0x3f800000bf800000;
  local_58._M_string_length = 0x3f80000000000000;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf8000003f800000;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = 1.0;
  local_1b8.m_data[2] = 0.0;
  local_1b8.m_data[3] = 1.0;
  combineVec4ToVec16(&res,(Vec4 *)&local_1e8,(Vec4 *)&local_58,(Vec4 *)&local_208,&local_1b8);
  ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_188,&ndxStr,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_98,(AttribSpec *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::operator+(&ndxStr,"a_normal",&nameSpec);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0xbf800000;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0xbf800000;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbf800000;
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = -1.0;
  local_1b8.m_data[3] = 0.0;
  combineVec4ToVec16(&res,(Vec4 *)&local_1e8,(Vec4 *)&local_58,(Vec4 *)&local_208,&local_1b8);
  ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_188,&ndxStr,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_98,(AttribSpec *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::operator+(&ndxStr,"a_texCoord0",&nameSpec);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_58._M_dataplus._M_p = (pointer)0x3f800000;
  local_58._M_string_length = 0;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = 1.0;
  local_1b8.m_data[2] = 0.0;
  local_1b8.m_data[3] = 0.0;
  combineVec4ToVec16(&res,(Vec4 *)&local_1e8,(Vec4 *)&local_58,(Vec4 *)&local_208,&local_1b8);
  ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_188,&ndxStr,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_98,(AttribSpec *)&local_188);
  pvVar1 = &local_1c8->vertexAttributes;
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::_M_move_assign(pvVar1,(vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                           *)local_98);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_98);
  iVar2 = this->m_numLights;
  LVar3 = this->m_lightType;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&ndxStr,"u_material_ambientColor",&nameSpec);
  local_98._0_8_ = (pointer)0x3f3333333f000000;
  local_98._8_4_ = 0x3f666666;
  vecTo16<3>(&res,(Vector<float,_3> *)local_98);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&ndxStr,TYPE_VEC3,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::operator+(&ndxStr,"u_material_diffuseColor",&nameSpec);
  local_98._0_8_ = (pointer)0x3ecccccd3e99999a;
  local_98._8_8_ = (pointer)0x3f8000003f000000;
  vecTo16<4>(&res,(Vector<float,_4> *)local_98);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&ndxStr,TYPE_VEC4,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::operator+(&ndxStr,"u_material_emissiveColor",&nameSpec);
  local_98._0_8_ = (pointer)0x3e4ccccd3f333333;
  local_98._8_4_ = 0.2;
  vecTo16<3>(&res,(Vector<float,_3> *)local_98);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&ndxStr,TYPE_VEC3,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::operator+(&ndxStr,"u_material_specularColor",&nameSpec);
  local_98._0_8_ = (pointer)0x3f19999a3e4ccccd;
  local_98._8_4_ = 0x3f800000;
  vecTo16<3>(&res,(Vector<float,_3> *)local_98);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&ndxStr,TYPE_VEC3,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&ndxStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                 "u_material_shininess",&nameSpec);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,(string *)&res,TYPE_FLOAT,0.8);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&res);
  for (local_1bc = 0; local_1bc < iVar2; local_1bc = local_1bc + 1) {
    de::toString<int>(&ndxStr,&local_1bc);
    std::operator+(&local_58,"u_light",&ndxStr);
    std::operator+(&local_1e8,&local_58,"_color");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_1e8,&nameSpec);
    local_1b8.m_data[0] = 0.8;
    local_1b8.m_data[1] = 0.6;
    local_1b8.m_data[2] = 0.3;
    vecTo16<3>(&res,(Vector<float,_3> *)&local_1b8);
    ShaderCompilerCase::UniformSpec::UniformSpec
              (&local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               TYPE_VEC3,&res);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188)
    ;
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_58);
    std::operator+(&local_58,"u_light",&ndxStr);
    std::operator+(&local_1e8,&local_58,"_direction");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_1e8,&nameSpec);
    local_1b8.m_data[0] = 0.2;
    local_1b8.m_data[1] = 0.3;
    local_1b8.m_data[2] = 0.4;
    vecTo16<3>(&res,(Vector<float,_3> *)&local_1b8);
    ShaderCompilerCase::UniformSpec::UniformSpec
              (&local_188,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               TYPE_VEC3,&res);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188)
    ;
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_58);
    if (LVar3 == LIGHT_POINT) {
      std::operator+(&local_58,"u_light",&ndxStr);
      std::operator+(&local_1e8,&local_58,"_position");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &local_1e8,&nameSpec);
      local_1b8.m_data[0] = 1.0;
      local_1b8.m_data[1] = 0.6;
      local_1b8.m_data[2] = 0.3;
      local_1b8.m_data[3] = 0.2;
      vecTo16<4>(&res,&local_1b8);
      ShaderCompilerCase::UniformSpec::UniformSpec
                (&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 TYPE_VEC4,&res);
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                (&local_208,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_58);
      std::operator+(&local_1e8,"u_light",&ndxStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &local_1e8,"_constantAttenuation");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &nameSpec);
      ShaderCompilerCase::UniformSpec::UniformSpec
                (&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                 TYPE_FLOAT,0.6);
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                (&local_208,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&res);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::operator+(&local_1e8,"u_light",&ndxStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &local_1e8,"_linearAttenuation");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &nameSpec);
      ShaderCompilerCase::UniformSpec::UniformSpec
                (&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                 TYPE_FLOAT,0.5);
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                (&local_208,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&res);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::operator+(&local_1e8,"u_light",&ndxStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &local_1e8,"_quadraticAttenuation");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &nameSpec);
      ShaderCompilerCase::UniformSpec::UniformSpec
                (&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                 TYPE_FLOAT,0.4);
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                (&local_208,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&res);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    std::__cxx11::string::~string((string *)&ndxStr);
  }
  std::operator+(&local_1e8,"u_mvpMatrix",&nameSpec);
  local_58._M_dataplus._M_p._0_4_ = 0x3f800000;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)local_98,(float *)&local_58);
  tcu::Matrix<float,_4,_4>::getColumnMajorData
            ((Array<float,_16> *)&ndxStr,(Matrix<float,_4,_4> *)local_98);
  arrTo16<16>(&res,(Array<float,_16> *)&ndxStr);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&local_1e8,TYPE_MAT4,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::operator+(&local_1e8,"u_modelViewMatrix",&nameSpec);
  local_58._M_dataplus._M_p._0_4_ = 0x3f800000;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)local_98,(float *)&local_58);
  tcu::Matrix<float,_4,_4>::getColumnMajorData
            ((Array<float,_16> *)&ndxStr,(Matrix<float,_4,_4> *)local_98);
  arrTo16<16>(&res,(Array<float,_16> *)&ndxStr);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&local_1e8,TYPE_MAT4,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::operator+(&local_1e8,"u_normalMatrix",&nameSpec);
  local_58._M_dataplus._M_p._0_4_ = 0x3f800000;
  tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)local_98,(float *)&local_58);
  tcu::Matrix<float,_3,_3>::getColumnMajorData
            ((Array<float,_9> *)&ndxStr,(Matrix<float,_3,_3> *)local_98);
  tcu::Vector<float,_16>::Vector(&res,0.0);
  for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
    res.m_data[lVar5] = *(float *)((long)&ndxStr._M_dataplus._M_p + lVar5 * 4);
  }
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&local_1e8,TYPE_MAT3,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::operator+(&local_1e8,"u_texCoordMatrix0",&nameSpec);
  local_58._M_dataplus._M_p._0_4_ = 0x3f800000;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)local_98,(float *)&local_58);
  tcu::Matrix<float,_4,_4>::getColumnMajorData
            ((Array<float,_16> *)&ndxStr,(Matrix<float,_4,_4> *)local_98);
  arrTo16<16>(&res,(Array<float,_16> *)&ndxStr);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,&local_1e8,TYPE_MAT4,&res);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                 "u_sampler0",&nameSpec);
  ShaderCompilerCase::UniformSpec::UniformSpec(&local_188,(string *)&res,TYPE_TEXTURE_UNIT,0.0);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>(&local_208,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&res);
  pPVar4 = local_1c8;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::_M_move_assign(&local_1c8->uniforms,&local_208);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_208);
  std::__cxx11::string::~string((string *)&nameSpec);
  return pPVar4;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerLightCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(lightVertexTemplate(m_numLights, m_isVertexCase, m_lightType), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(lightFragmentTemplate(m_numLights, m_isVertexCase, m_lightType), specID, SHADER_VALIDITY_VALID);
	result.vertexAttributes		= lightShaderAttributes(nameSpec);
	result.uniforms				= lightShaderUniforms(nameSpec, m_numLights, m_lightType);

	return result;
}